

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::WriteMacOSXContentBuild
          (cmGlobalNinjaGenerator *this,string *input,string *output)

{
  cmNinjaBuild build;
  char *local_150;
  size_type local_148;
  char local_140 [8];
  undefined8 uStack_138;
  undefined1 local_130 [64];
  pointer local_f0;
  pointer pbStack_e8;
  pointer local_e0;
  pointer pbStack_d8;
  pointer local_d0;
  pointer pbStack_c8;
  pointer local_c0;
  pointer pbStack_b8;
  pointer local_b0;
  pointer pbStack_a8;
  pointer local_a0;
  pointer pbStack_98;
  pointer local_90;
  pointer pbStack_88;
  pointer local_80;
  _Rb_tree_node_base local_70;
  size_t local_50;
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  AddMacOSXContentRule(this);
  local_150 = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"COPY_OSX_CONTENT","");
  local_130._0_8_ = local_130 + 0x10;
  local_130._8_8_ = 0;
  local_130[0x10] = '\0';
  local_130._32_8_ = local_130 + 0x30;
  if (local_150 == local_140) {
    local_130._56_8_ = uStack_138;
  }
  else {
    local_130._32_8_ = local_150;
  }
  local_130._40_8_ = local_148;
  local_148 = 0;
  local_140[0] = '\0';
  local_70._M_left = &local_70;
  local_70._M_color = _S_red;
  local_70._M_parent = (_Base_ptr)0x0;
  local_f0 = (pointer)0x0;
  pbStack_e8 = (pointer)0x0;
  local_e0 = (pointer)0x0;
  pbStack_d8 = (pointer)0x0;
  local_d0 = (pointer)0x0;
  pbStack_c8 = (pointer)0x0;
  local_c0 = (pointer)0x0;
  pbStack_b8 = (pointer)0x0;
  local_b0 = (pointer)0x0;
  pbStack_a8 = (pointer)0x0;
  local_a0 = (pointer)0x0;
  pbStack_98 = (pointer)0x0;
  local_90 = (pointer)0x0;
  pbStack_88 = (pointer)0x0;
  local_80 = (pointer)0x0;
  local_50 = 0;
  local_48._M_p = (pointer)&local_38;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_150 = local_140;
  local_70._M_right = local_70._M_left;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f0,output);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c0,input);
  WriteBuild(this,(ostream *)
                  (this->BuildFileStream)._M_t.
                  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                  .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
             (cmNinjaBuild *)local_130,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_130);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteMacOSXContentBuild(std::string input,
                                                     std::string output)
{
  this->AddMacOSXContentRule();
  {
    cmNinjaBuild build("COPY_OSX_CONTENT");
    build.Outputs.push_back(std::move(output));
    build.ExplicitDeps.push_back(std::move(input));
    this->WriteBuild(*this->BuildFileStream, build);
  }
}